

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int pull_all(FILE *fp,mg_connection *conn,char *buf,int len)

{
  int iVar1;
  uint64_t uVar2;
  ulong uVar3;
  uint64_t uVar4;
  bool bVar5;
  double dVar6;
  uint64_t timeout_ns;
  uint64_t now;
  uint64_t start_time;
  double timeout;
  int nread;
  int n;
  int len_local;
  char *buf_local;
  mg_connection *conn_local;
  FILE *fp_local;
  
  timeout._4_4_ = 0;
  start_time = 0xbff0000000000000;
  if (conn->dom_ctx->config[0xb] != (char *)0x0) {
    iVar1 = atoi(conn->dom_ctx->config[0xb]);
    start_time = (uint64_t)((double)iVar1 / 1000.0);
  }
  if ((double)start_time <= 0.0) {
    dVar6 = strtod("30000",(char **)0x0);
    start_time = (uint64_t)(dVar6 / 1000.0);
  }
  uVar2 = mg_get_current_time_ns();
  uVar3 = (ulong)((double)start_time * 1000000000.0);
  nread = len;
  do {
    while( true ) {
      bVar5 = false;
      if (0 < nread) {
        bVar5 = conn->phys_ctx->stop_flag == 0;
      }
      if (!bVar5) {
        return timeout._4_4_;
      }
      iVar1 = pull_inner(fp,conn,buf + timeout._4_4_,nread,(double)start_time);
      if (iVar1 == -2) {
        if (timeout._4_4_ == 0) {
          timeout._4_4_ = -1;
        }
        return timeout._4_4_;
      }
      if (iVar1 == -1) break;
      if (iVar1 == 0) {
        return timeout._4_4_;
      }
      timeout._4_4_ = iVar1 + timeout._4_4_;
      nread = nread - iVar1;
    }
    if ((double)start_time < 0.0) {
      return timeout._4_4_;
    }
    uVar4 = mg_get_current_time_ns();
  } while (uVar4 - uVar2 <=
           (uVar3 | (long)((double)start_time * 1000000000.0 - 9.223372036854776e+18) &
                    (long)uVar3 >> 0x3f));
  return timeout._4_4_;
}

Assistant:

static int
pull_all(FILE *fp, struct mg_connection *conn, char *buf, int len)
{
	int n, nread = 0;
	double timeout = -1.0;
	uint64_t start_time = 0, now = 0, timeout_ns = 0;

	if (conn->dom_ctx->config[REQUEST_TIMEOUT]) {
		timeout = atoi(conn->dom_ctx->config[REQUEST_TIMEOUT]) / 1000.0;
	}
	if (timeout <= 0.0) {
		timeout = strtod(config_options[REQUEST_TIMEOUT].default_value, NULL)
		          / 1000.0;
	}
	start_time = mg_get_current_time_ns();
	timeout_ns = (uint64_t)(timeout * 1.0E9);

	while ((len > 0) && STOP_FLAG_IS_ZERO(&conn->phys_ctx->stop_flag)) {
		n = pull_inner(fp, conn, buf + nread, len, timeout);
		if (n == -2) {
			if (nread == 0) {
				nread = -1; /* Propagate the error */
			}
			break;
		} else if (n == -1) {
			/* timeout */
			if (timeout >= 0.0) {
				now = mg_get_current_time_ns();
				if ((now - start_time) <= timeout_ns) {
					continue;
				}
			}
			break;
		} else if (n == 0) {
			break; /* No more data to read */
		} else {
			nread += n;
			len -= n;
		}
	}

	return nread;
}